

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void __thiscall SQFuncState::AddInstruction(SQFuncState *this,SQInstruction *i)

{
  ulong uVar1;
  SQUnsignedInteger *pSVar2;
  byte bVar3;
  int iVar4;
  SQInstruction *p;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  SQUnsignedInteger SVar8;
  
  uVar5 = (this->_instructions)._size;
  if ((long)uVar5 < 1) {
    p = (this->_instructions)._vals;
    goto switchD_00120b72_caseD_2;
  }
  p = (this->_instructions)._vals;
  if ((this->_optimization != true) || (bVar6 = i->op, 0x22 < bVar6)) goto switchD_00120b72_caseD_2;
  uVar1 = uVar5 - 1;
  switch(bVar6) {
  case 0:
    if (p[uVar5 - 1].op == '\0') {
      (this->_instructions)._size = uVar1;
      pSVar2 = &(this->_lineinfos)._size;
      *pSVar2 = *pSVar2 - 1;
      uVar5 = uVar1;
    }
    break;
  case 1:
    uVar7 = i->_arg1;
    if ((int)uVar7 < 0x100 && p[uVar5 - 1].op == '\x01') {
      p[uVar5 - 1].op = '\x04';
LAB_00120e8d:
      p[uVar5 - 1]._arg2 = i->_arg0;
      p[uVar5 - 1]._arg3 = (uchar)uVar7;
      return;
    }
    break;
  case 7:
    if (((p[uVar5 - 1].op == '\x01') && (bVar6 = p[uVar5 - 1]._arg0, i->_arg1 == (uint)bVar6)) &&
       (((this->_vlocals)._size <= (ulong)bVar6 ||
        ((this->_vlocals)._vals[bVar6]._name.super_SQObject._type == OT_NULL)))) {
      p[uVar5 - 1].op = '\b';
      p[uVar5 - 1]._arg0 = i->_arg0;
      p[uVar5 - 1]._arg2 = i->_arg2;
      p[uVar5 - 1]._arg3 = i->_arg3;
      return;
    }
    break;
  case 10:
    bVar6 = p[uVar5 - 1].op;
    if (bVar6 < 0x1b) {
      if ((0x47e400eU >> (bVar6 & 0x1f) & 1) == 0) {
        if (bVar6 != 10) break;
        uVar7 = i->_arg1;
      }
      else {
        uVar7 = i->_arg1;
        if (uVar7 == p[uVar5 - 1]._arg0) {
          p[uVar5 - 1]._arg0 = i->_arg0;
          this->_optimization = false;
          return;
        }
        if (bVar6 != 10) break;
      }
      p[uVar5 - 1].op = '\x1b';
      goto LAB_00120e8d;
    }
    break;
  case 0xb:
  case 0xd:
    if (i->_arg0 != i->_arg3) break;
    goto LAB_00120e23;
  case 0xe:
    if (((p[uVar5 - 1].op == '\x01') && (bVar6 = p[uVar5 - 1]._arg0, bVar6 == i->_arg2)) &&
       (((this->_vlocals)._size <= (ulong)bVar6 ||
        ((this->_vlocals)._vals[bVar6]._name.super_SQObject._type == OT_NULL)))) {
      p[uVar5 - 1]._arg2 = (uchar)i->_arg1;
      p[uVar5 - 1].op = '\t';
      p[uVar5 - 1]._arg0 = i->_arg0;
      return;
    }
    break;
  case 0xf:
  case 0x10:
    if (((p[uVar5 - 1].op == '\x01') && (bVar3 = p[uVar5 - 1]._arg0, i->_arg1 == (uint)bVar3)) &&
       (((this->_vlocals)._size <= (ulong)bVar3 ||
        ((this->_vlocals)._vals[bVar3]._name.super_SQObject._type == OT_NULL)))) {
      p[uVar5 - 1].op = bVar6;
      p[uVar5 - 1]._arg0 = i->_arg0;
      bVar6 = i->_arg2;
LAB_00120cfc:
      p[uVar5 - 1]._arg2 = bVar6;
      p[uVar5 - 1]._arg3 = 0xff;
      return;
    }
    break;
  case 0x17:
    if ((((this->_parent == (SQFuncState *)0x0) || (i->_arg0 == 0xff)) ||
        (p[uVar5 - 1].op != '\x06')) || ((long)uVar1 <= this->_returnexp)) {
      if (p[uVar5 - 1].op == '<') {
        p[uVar5 - 1] = *i;
        return;
      }
    }
    else {
      p[uVar5 - 1].op = '\x05';
    }
    break;
  case 0x18:
    if ((p[uVar5 - 1].op == '\x18') &&
       ((uint)p[uVar5 - 1]._arg0 + p[uVar5 - 1]._arg1 == (uint)i->_arg0)) {
      p[uVar5 - 1]._arg1 = p[uVar5 - 1]._arg1 + 1;
      p[uVar5 - 1].op = '\x18';
      return;
    }
    break;
  case 0x1e:
    if ((p[uVar5 - 1].op == '(') && (iVar4 = p[uVar5 - 1]._arg1, iVar4 < 0xff)) {
      p[uVar5 - 1].op = '\x1d';
      p[uVar5 - 1]._arg0 = (uchar)iVar4;
      p[uVar5 - 1]._arg1 = i->_arg1;
      return;
    }
    break;
  case 0x1f:
    if (i->_arg0 != i->_arg2) break;
LAB_00120e23:
    i->_arg0 = 0xff;
    break;
  case 0x22:
    bVar6 = p[uVar5 - 1].op;
    if (2 < bVar6 - 1) {
      if (bVar6 != 0x1a) break;
      bVar6 = 4;
    }
    bVar3 = p[uVar5 - 1]._arg0;
    if ((i->_arg1 == (uint)bVar3) &&
       (((this->_vlocals)._size <= (ulong)bVar3 ||
        ((this->_vlocals)._vals[bVar3]._name.super_SQObject._type == OT_NULL)))) {
      p[uVar5 - 1].op = '\"';
      p[uVar5 - 1]._arg0 = i->_arg0;
      goto LAB_00120cfc;
    }
  }
switchD_00120b72_caseD_2:
  this->_optimization = true;
  uVar1 = (this->_instructions)._allocated;
  if (uVar1 <= uVar5) {
    SVar8 = 4;
    if (uVar5 * 2 != 0) {
      SVar8 = uVar5 * 2;
    }
    p = (SQInstruction *)sq_vm_realloc(p,uVar1 << 3,SVar8 * 8);
    (this->_instructions)._vals = p;
    (this->_instructions)._allocated = SVar8;
    uVar5 = (this->_instructions)._size;
  }
  (this->_instructions)._size = uVar5 + 1;
  p[uVar5] = *i;
  return;
}

Assistant:

void SQFuncState::AddInstruction(SQInstruction &i)
{
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){ //simple optimizer
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(i.op) {
        case _OP_JZ:
            if( pi.op == _OP_CMP && pi._arg1 < 0xFF) {
                pi.op = _OP_JCMP;
                pi._arg0 = (unsigned char)pi._arg1;
                pi._arg1 = i._arg1;
                return;
            }
            break;
        case _OP_SET:
        case _OP_NEWSLOT:
            if(i._arg0 == i._arg3) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_SETOUTER:
            if(i._arg0 == i._arg2) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_RETURN:
            if( _parent && i._arg0 != MAX_FUNC_STACKSIZE && pi.op == _OP_CALL && _returnexp < size-1) {
                pi.op = _OP_TAILCALL;
            } else if(pi.op == _OP_CLOSE){
                pi = i;
                return;
            }
        break;
        case _OP_GET:
            if( pi.op == _OP_LOAD && pi._arg0 == i._arg2 && (!IsLocal(pi._arg0))){
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)i._arg1;
                pi.op = _OP_GETK;
                pi._arg0 = i._arg0;

                return;
            }
        break;
        case _OP_PREPCALL:
            if( pi.op == _OP_LOAD  && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_PREPCALLK;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = i._arg3;
                return;
            }
            break;
        case _OP_APPENDARRAY: {
            SQInteger aat = -1;
            switch(pi.op) {
            case _OP_LOAD: aat = AAT_LITERAL; break;
            case _OP_LOADINT: aat = AAT_INT; break;
            case _OP_LOADBOOL: aat = AAT_BOOL; break;
            case _OP_LOADFLOAT: aat = AAT_FLOAT; break;
            default: break;
            }
            if(aat != -1 && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_APPENDARRAY;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)aat;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
                              }
            break;
        case _OP_MOVE:
            switch(pi.op) {
            case _OP_GET: case _OP_ADD: case _OP_SUB: case _OP_MUL: case _OP_DIV: case _OP_MOD: case _OP_BITW:
            case _OP_LOADINT: case _OP_LOADFLOAT: case _OP_LOADBOOL: case _OP_LOAD:

                if(pi._arg0 == i._arg1)
                {
                    pi._arg0 = i._arg0;
                    _optimization = false;
                    //_result_elimination = false;
                    return;
                }
            }

            if(pi.op == _OP_MOVE)
            {
                pi.op = _OP_DMOVE;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_LOAD:
            if(pi.op == _OP_LOAD && i._arg1 < 256) {
                pi.op = _OP_DLOAD;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_EQ:case _OP_NE:
            if(pi.op == _OP_LOAD && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0) ))
            {
                pi.op = i.op;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
            break;
        case _OP_LOADNULLS:
            if((pi.op == _OP_LOADNULLS && pi._arg0+pi._arg1 == i._arg0)) {

                pi._arg1 = pi._arg1 + 1;
                pi.op = _OP_LOADNULLS;
                return;
            }
            break;
        case _OP_LINE:
            if(pi.op == _OP_LINE) {
                _instructions.pop_back();
                _lineinfos.pop_back();
            }
            break;
        }
    }
    _optimization = true;
    _instructions.push_back(i);
}